

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

uchar * rsa_pkcs1_signature_string(size_t nbytes,ssh_hashalg *halg,ptrlen data)

{
  ulong uVar1;
  uchar *puVar2;
  ssh_hash *psVar3;
  undefined1 *__src;
  size_t __n;
  
  if (halg != &ssh_sha1) {
    if (halg == &ssh_sha512 || halg == &ssh_sha256) {
      uVar1 = halg->hlen + 0x16;
      if (nbytes < uVar1) goto LAB_0013580f;
      __src = rsa_pkcs1_prefix_for_hash_sha512_asn1_prefix;
      if (halg == &ssh_sha256) {
        __src = rsa_pkcs1_prefix_for_hash_sha256_asn1_prefix;
      }
      __n = 0x14;
      if (halg == &ssh_sha256 || halg == &ssh_sha512) goto LAB_0013577e;
    }
    __assert_fail("false && \"bad hash algorithm for RSA PKCS#1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                  0x2ca,"ptrlen rsa_pkcs1_prefix_for_hash(const ssh_hashalg *)");
  }
  uVar1 = 0x26;
  if (0x25 < nbytes) {
    __n = 0x10;
    __src = rsa_pkcs1_prefix_for_hash_sha1_asn1_prefix;
LAB_0013577e:
    puVar2 = (uchar *)safemalloc(nbytes,1,0);
    puVar2[0] = '\0';
    puVar2[1] = '\x01';
    memset(puVar2 + 2,0xff,nbytes - uVar1);
    memcpy(puVar2 + (nbytes - uVar1) + 2,__src,__n);
    psVar3 = (*halg->new)(halg);
    if (psVar3 != (ssh_hash *)0x0) {
      (*psVar3->vt->reset)(psVar3);
    }
    BinarySink_put_datapl(psVar3->binarysink_,data);
    (*psVar3->vt->digest)(psVar3,puVar2 + (nbytes - uVar1) + 2 + __n);
    (*psVar3->vt->free)(psVar3);
    return puVar2;
  }
LAB_0013580f:
  __assert_fail("nbytes >= fixed_parts",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                0x2d7,
                "unsigned char *rsa_pkcs1_signature_string(size_t, const ssh_hashalg *, ptrlen)");
}

Assistant:

static unsigned char *rsa_pkcs1_signature_string(
    size_t nbytes, const ssh_hashalg *halg, ptrlen data)
{
    size_t fixed_parts = rsa_pkcs1_length_of_fixed_parts(halg);
    assert(nbytes >= fixed_parts);
    size_t padding = nbytes - fixed_parts;

    ptrlen asn1_prefix = rsa_pkcs1_prefix_for_hash(halg);

    unsigned char *bytes = snewn(nbytes, unsigned char);

    bytes[0] = 0;
    bytes[1] = 1;

    memset(bytes + 2, 0xFF, padding);

    memcpy(bytes + 2 + padding, asn1_prefix.ptr, asn1_prefix.len);

    ssh_hash *h = ssh_hash_new(halg);
    put_datapl(h, data);
    ssh_hash_final(h, bytes + 2 + padding + asn1_prefix.len);

    return bytes;
}